

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

CURLcode auth_digest_get_qop_values(char *options,int *value)

{
  int iVar1;
  char *local_38;
  char *tok_buf;
  char *token;
  char *tmp;
  int *value_local;
  char *options_local;
  
  local_38 = (char *)0x0;
  *value = 0;
  tmp = (char *)value;
  value_local = (int *)options;
  token = (*Curl_cstrdup)(options);
  if (token == (char *)0x0) {
    options_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    tok_buf = strtok_r(token,",",&local_38);
    while (tok_buf != (char *)0x0) {
      iVar1 = Curl_strcasecompare(tok_buf,"auth");
      if (iVar1 == 0) {
        iVar1 = Curl_strcasecompare(tok_buf,"auth-int");
        if (iVar1 == 0) {
          iVar1 = Curl_strcasecompare(tok_buf,"auth-conf");
          if (iVar1 != 0) {
            *(uint *)tmp = *(uint *)tmp | 4;
          }
        }
        else {
          *(uint *)tmp = *(uint *)tmp | 2;
        }
      }
      else {
        *(uint *)tmp = *(uint *)tmp | 1;
      }
      tok_buf = strtok_r((char *)0x0,",",&local_38);
    }
    (*Curl_cfree)(token);
    options_local._4_4_ = CURLE_OK;
  }
  return options_local._4_4_;
}

Assistant:

static CURLcode auth_digest_get_qop_values(const char *options, int *value)
{
  char *tmp;
  char *token;
  char *tok_buf = NULL;

  /* Initialise the output */
  *value = 0;

  /* Tokenise the list of qop values. Use a temporary clone of the buffer since
     strtok_r() ruins it. */
  tmp = strdup(options);
  if(!tmp)
    return CURLE_OUT_OF_MEMORY;

  token = strtok_r(tmp, ",", &tok_buf);
  while(token) {
    if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH))
      *value |= DIGEST_QOP_VALUE_AUTH;
    else if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH_INT))
      *value |= DIGEST_QOP_VALUE_AUTH_INT;
    else if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH_CONF))
      *value |= DIGEST_QOP_VALUE_AUTH_CONF;

    token = strtok_r(NULL, ",", &tok_buf);
  }

  free(tmp);

  return CURLE_OK;
}